

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Gia_Man_t * Lf_ManDeriveMapping(Lf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  Gia_Man_t *p_00;
  int iVar2;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  Lf_Cut_t *pLVar4;
  ulong uVar5;
  int v;
  
  pJVar1 = p->pPars;
  if ((pJVar1->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6b2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  p_01 = Vec_IntAlloc(p->pGia->nObjs + (int)pJVar1->Edge + (int)pJVar1->Area * 2);
  v = 0;
  Vec_IntFill(p_01,p->pGia->nObjs,0);
  do {
    p_00 = p->pGia;
    if (p_00->nObjs <= v) {
      if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
        __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0x6c2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
      }
      p_00->vMapping = p_01;
      return p_00;
    }
    pGVar3 = Gia_ManObj(p_00,v);
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      iVar2 = Lf_ObjMapRefNum(p,v);
      if (iVar2 != 0) {
        pGVar3 = Gia_ManObj(p->pGia,v);
        iVar2 = Gia_ObjIsBuf(pGVar3);
        if (iVar2 != 0) {
          __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0x6b9,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
        }
        pLVar4 = Lf_ObjCutBest(p,v);
        if ((pLVar4->field_0x16 & 0x80) != 0) {
          __assert_fail("!pCut->fMux7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0x6bb,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
        }
        Vec_IntWriteEntry(p_01,v,p_01->nSize);
        Vec_IntPush(p_01,(uint)(byte)pLVar4->field_0x17);
        for (uVar5 = 0; uVar5 < (byte)pLVar4->field_0x17; uVar5 = uVar5 + 1) {
          Vec_IntPush(p_01,*(int *)((long)&pLVar4[1].Sign + uVar5 * 4));
        }
        Vec_IntPush(p_01,v);
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Lf_ManDeriveMapping( Lf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Lf_ObjCutBest( p, i );
        assert( !pCut->fMux7 );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( vMapping, pCut->pLeaves[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}